

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

bool baryonyx::itm::
     affect<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
               (solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                *slv,bit_array *x,row_value *it,int k,int selected,int r_size,float kappa,
               float delta)

{
  float fVar1;
  rc_data *prVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  float *pfVar11;
  long lVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_register_00001204 [60];
  undefined1 in_register_00001244 [12];
  float fVar17;
  
  pfVar11 = (slv->pi)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
            super__Head_base<0UL,_float_*,_false>._M_head_impl;
  fVar1 = pfVar11[k];
  auVar14._4_12_ = in_register_00001204._0_12_;
  if (selected < 0) {
    if (r_size != 0) {
      lVar12 = 0;
      auVar15._0_4_ = kappa / (1.0 - kappa);
      auVar15._4_12_ = auVar14._4_12_;
      auVar5._4_12_ = in_register_00001244;
      auVar5._0_4_ = delta;
      auVar14 = vfmadd213ss_fma(ZEXT416((uint)(((slv->R)._M_t.
                                                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                                                .
                                                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
                                               ._M_head_impl)->value * 0.5)),auVar15,auVar5);
      do {
        prVar2 = (slv->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
                 ._M_head_impl;
        iVar7 = *(int *)((long)&prVar2->id + lVar12);
        if (*(int *)((long)&prVar2->f + lVar12) < 0) {
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar7].column);
          lVar8 = (long)it[iVar7].value;
          pfVar11 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                    super__Head_base<0UL,_float_*,_false>._M_head_impl;
          fVar17 = auVar14._0_4_ + pfVar11[lVar8];
        }
        else {
          bit_array_impl::unset(&x->super_bit_array_impl,it[iVar7].column);
          lVar8 = (long)it[iVar7].value;
          pfVar11 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                    super__Head_base<0UL,_float_*,_false>._M_head_impl;
          fVar17 = pfVar11[lVar8] - auVar14._0_4_;
        }
        lVar12 = lVar12 + 0xc;
        pfVar11[lVar8] = fVar17;
      } while ((ulong)(uint)r_size * 0xc != lVar12);
    }
  }
  else if ((int)(selected + 1U) < r_size) {
    prVar2 = (slv->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
             ._M_head_impl;
    uVar10 = (ulong)(selected + 1U);
    lVar12 = 0;
    pfVar11[k] = (prVar2[(uint)selected].value + prVar2[uVar10].value) * 0.5 + fVar1;
    auVar14._0_4_ = kappa / (1.0 - kappa);
    auVar3._4_12_ = in_register_00001244;
    auVar3._0_4_ = delta;
    auVar14 = vfmadd213ss_fma(ZEXT416((uint)(prVar2[uVar10].value - prVar2[(uint)selected].value)),
                              auVar14,auVar3);
    fVar17 = auVar14._0_4_;
    do {
      prVar2 = (slv->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
               ._M_head_impl;
      iVar7 = *(int *)((long)&prVar2->id + lVar12);
      if (*(int *)((long)&prVar2->f + lVar12) < 0) {
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar7].column);
        lVar8 = (long)it[iVar7].value;
        pfVar11 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl;
        fVar13 = pfVar11[lVar8] - fVar17;
      }
      else {
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar7].column);
        lVar8 = (long)it[iVar7].value;
        pfVar11 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl;
        fVar13 = fVar17 + pfVar11[lVar8];
      }
      lVar12 = lVar12 + 0xc;
      pfVar11[lVar8] = fVar13;
    } while (uVar10 * 0xc != lVar12);
    lVar8 = (uint)r_size - uVar10;
    lVar12 = uVar10 * 0xc + 8;
    do {
      prVar2 = (slv->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
               ._M_head_impl;
      iVar7 = *(int *)((long)&prVar2->value + lVar12);
      if (*(int *)((long)prVar2 + lVar12 + -4) < 0) {
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar7].column);
        lVar9 = (long)it[iVar7].value;
        pfVar11 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl;
        fVar13 = fVar17 + pfVar11[lVar9];
      }
      else {
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar7].column);
        lVar9 = (long)it[iVar7].value;
        pfVar11 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl;
        fVar13 = pfVar11[lVar9] - fVar17;
      }
      lVar12 = lVar12 + 0xc;
      lVar8 = lVar8 + -1;
      pfVar11[lVar9] = fVar13;
    } while (lVar8 != 0);
  }
  else if (r_size != 0) {
    lVar12 = 0;
    auVar16._0_4_ = kappa / (1.0 - kappa);
    auVar16._4_12_ = auVar14._4_12_;
    auVar4._4_12_ = in_register_00001244;
    auVar4._0_4_ = delta;
    auVar14 = vfmadd213ss_fma(ZEXT416((uint)((slv->R)._M_t.
                                             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
                                             ._M_head_impl[(uint)selected].value * 1.5)),auVar16,
                              auVar4);
    do {
      prVar2 = (slv->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
               ._M_head_impl;
      iVar7 = *(int *)((long)&prVar2->id + lVar12);
      if (*(int *)((long)&prVar2->f + lVar12) < 0) {
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar7].column);
        lVar8 = (long)it[iVar7].value;
        pfVar11 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl;
        fVar17 = pfVar11[lVar8] - auVar14._0_4_;
      }
      else {
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar7].column);
        lVar8 = (long)it[iVar7].value;
        pfVar11 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl;
        fVar17 = auVar14._0_4_ + pfVar11[lVar8];
      }
      lVar12 = lVar12 + 0xc;
      pfVar11[lVar8] = fVar17;
    } while ((ulong)(uint)r_size * 0xc != lVar12);
  }
  bVar6 = is_valid_constraint<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
                    (slv,k,x);
  if (!bVar6) {
    affect<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
              ();
  }
  iVar7 = vmovmskps_avx(ZEXT416((uint)fVar1));
  return (bool)((byte)((byte)((uint)(iVar7 << 0x1f) >> 0x18) ^
                      (byte)((uint)(slv->pi)._M_t.
                                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                   super__Head_base<0UL,_float_*,_false>._M_head_impl[k] >> 0x18))
               >> 7);
}

Assistant:

bool
affect(Solver& slv,
       Xtype& x,
       Iterator it,
       int k,
       int selected,
       int r_size,
       const Float kappa,
       const Float delta)
{
    constexpr Float one{ 1 };
    constexpr Float two{ 2 };
    constexpr Float middle{ (two + one) / two };

    const auto old_pi = slv.pi[k];

    auto d = delta;

    if (selected < 0) {
        // slv.pi[k] += slv.R[0].value / two;
        d += (kappa / (one - kappa)) * (slv.R[0].value / two);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    } else if (selected + 1 >= r_size) {
        // slv.pi[k] += slv.R[selected].value * middle;
        d += (kappa / (one - kappa)) * (slv.R[selected].value * middle);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }
    } else {
        slv.pi[k] +=
          ((slv.R[selected].value + slv.R[selected + 1].value) / two);
        d += (kappa / (one - kappa)) *
             (slv.R[selected + 1].value - slv.R[selected].value);

        int i = 0;
        for (; i <= selected; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }

        for (; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    }

    // TODO job: develops is_valid_constraint for all the solvers
    bx_expects(is_valid_constraint(slv, k, x));

    return is_signbit_change(old_pi, slv.pi[k]);
}